

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_compress_parallel_frames(AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data)

{
  uint in_EAX;
  uint uVar1;
  int iVar2;
  AVxWorkerInterface *pAVar3;
  ulong uVar4;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  bool bVar6;
  aom_internal_error_info *src;
  ulong uVar7;
  int ref_buffers_used_map;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  uVar1 = av1_init_parallel_frame_context(first_cpi_data,ppi,(int *)((long)&uStack_38 + 4));
  prepare_fpmt_workers(ppi,first_cpi_data,(AVxWorkerHook)(ulong)uVar1,in_ECX);
  pAVar3 = aom_get_worker_interface();
  for (uVar4 = (ulong)(uint)(ppi->p_mt_info).p_num_workers; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    (*(&pAVar3->launch)[uVar4 == 1])((ppi->p_mt_info).p_workers[uVar4 - 1]);
  }
  pAVar3 = aom_get_worker_interface();
  bVar6 = true;
  src = (aom_internal_error_info *)0x0;
  uVar5 = extraout_RDX;
  uVar4 = (ulong)(uint)(ppi->p_mt_info).p_num_workers;
  while (uVar7 = uVar4, 0 < (int)uVar7) {
    iVar2 = (*pAVar3->sync)((ppi->p_mt_info).p_workers[uVar7 - 1]);
    uVar5 = extraout_RDX_00;
    uVar4 = uVar7 - 1;
    if (iVar2 == 0) {
      src = (ppi->parallel_cpi[uVar7 - 1]->common).error;
      bVar6 = false;
    }
  }
  restore_workers_after_fpmt(ppi,(ppi->p_mt_info).num_workers,(int)uVar5);
  if (!bVar6) {
    aom_internal_error_copy(&ppi->error,src);
  }
  uVar7 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar7;
  }
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    av1_release_scaled_references_fpmt(ppi->parallel_cpi[uVar7]);
  }
  av1_decrement_ref_counts_fpmt((ppi->cpi->common).buffer_pool,uStack_38._4_4_);
  return;
}

Assistant:

void av1_compress_parallel_frames(AV1_PRIMARY *const ppi,
                                  AV1_COMP_DATA *const first_cpi_data) {
  // Bitmask for the frame buffers referenced by cpi->scaled_ref_buf
  // corresponding to frames in the current parallel encode set.
  int ref_buffers_used_map = 0;
  int frames_in_parallel_set = av1_init_parallel_frame_context(
      first_cpi_data, ppi, &ref_buffers_used_map);
  prepare_fpmt_workers(ppi, first_cpi_data, get_compressed_data_hook,
                       frames_in_parallel_set);
  launch_fpmt_workers(ppi);
  sync_fpmt_workers(ppi, frames_in_parallel_set);

  // Release cpi->scaled_ref_buf corresponding to frames in the current parallel
  // encode set.
  for (int i = 0; i < frames_in_parallel_set; ++i) {
    av1_release_scaled_references_fpmt(ppi->parallel_cpi[i]);
  }
  av1_decrement_ref_counts_fpmt(ppi->cpi->common.buffer_pool,
                                ref_buffers_used_map);
}